

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicy.cpp
# Opt level: O0

void __thiscall GmmLib::GmmGen12dGPUCachePolicy::SetUpMOCSTable(GmmGen12dGPUCachePolicy *this)

{
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar1;
  GMM_PLATFORM_INFO *pGVar2;
  int local_28;
  int local_24;
  int index_3;
  int index_2;
  int index_1;
  int index;
  GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement;
  GmmGen12dGPUCachePolicy *this_local;
  
  pGVar1 = Context::GetCachePolicyTlbElement
                     ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                      super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                      super_GmmCachePolicyCommon.pGmmLibContext);
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
  super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0;
  (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.CurrentMaxSpecialMocsIndex = 0;
  pGVar2 = Context::GetPlatformInfo
                     ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                      super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                      super_GmmCachePolicyCommon.pGmmLibContext);
  if ((pGVar2->Platform).eProductFamily == IGFX_DG1) {
    for (index_2 = 0; index_2 < 0x40; index_2 = index_2 + 1) {
      pGVar1[index_2].L3.UshortValue = pGVar1[index_2].L3.UshortValue & 0xfffe;
      pGVar1[index_2].L3.UshortValue = pGVar1[index_2].L3.UshortValue & 0xfff1;
      pGVar1[index_2].L3.UshortValue = pGVar1[index_2].L3.UshortValue & 0xffcf | 0x30;
      pGVar1[index_2].L3.UshortValue = pGVar1[index_2].L3.UshortValue & 0xffbf;
      pGVar1[index_2].L3.UshortValue = pGVar1[index_2].L3.UshortValue & 0xff7f;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xfffffff3;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xffffffcf;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xffffffbf;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xffffff7f;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xffffbfff;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[index_2].LeCC.DwordValue = pGVar1[index_2].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[index_2].HDCL1 = '\0';
    }
    (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xfffe;
    (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xfff1;
    (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xffcf | 0x10;
    (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xffbf;
    (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xff7f;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffffffc | 1;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffffff3;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffffcf;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffffbf;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffff7f;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffff8ff;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffc7ff;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffbfff;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffe7fff;
    (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfff9ffff;
    pGVar1->HDCL1 = '\0';
    pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfffe;
    pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfff1;
    pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffcf | 0x10;
    pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffbf;
    pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xff7f;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffff3;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffcf;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffbf;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffff7f;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffbfff;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[1].HDCL1 = '\0';
    pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfffe;
    pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfff1;
    pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffcf;
    pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffbf;
    pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xff7f;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffff3;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffcf;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffbf;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffff7f;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffbfff;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[2].HDCL1 = '\0';
    pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfffe;
    pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfff1;
    pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffcf;
    pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffbf;
    pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xff7f;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffff3;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffffcf;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffffbf;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffff7f;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffbfff;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[3].HDCL1 = '\0';
    pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xfffe;
    pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xfff1;
    pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xffcf;
    pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xffbf;
    pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xff7f;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffffff3;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffffcf;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffffbf;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffff7f;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffbfff;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[4].HDCL1 = '\0';
    pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xfffe;
    pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xfff1;
    pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xffcf | 0x30;
    pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xffbf;
    pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xff7f;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffffff3;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffffcf;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffffbf;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffff7f;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffbfff;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[5].HDCL1 = '\0';
    pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xfffe | 1;
    pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xfff1 | 2;
    pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xffcf | 0x30;
    pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xffbf;
    pGVar1[6].L3.UshortValue = pGVar1[6].L3.UshortValue & 0xff7f;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffffff3;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffffcf;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffffbf;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffff7f;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xffffbfff;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[6].LeCC.DwordValue = pGVar1[6].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[6].HDCL1 = '\0';
    pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xfffe | 1;
    pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xfff1 | 6;
    pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xffcf | 0x30;
    pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xffbf;
    pGVar1[7].L3.UshortValue = pGVar1[7].L3.UshortValue & 0xff7f;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffffff3;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffffcf;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffffbf;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffff7f;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xffffbfff;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[7].LeCC.DwordValue = pGVar1[7].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[7].HDCL1 = '\0';
    pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xfffe | 1;
    pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xfff1 | 0xe;
    pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xffcf | 0x30;
    pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xffbf;
    pGVar1[8].L3.UshortValue = pGVar1[8].L3.UshortValue & 0xff7f;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffffff3;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffffcf;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffffbf;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffff7f;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xffffbfff;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[8].LeCC.DwordValue = pGVar1[8].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[8].HDCL1 = '\0';
    pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xfffe;
    pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xfff1;
    pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xffcf | 0x30;
    pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xffbf;
    pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xff7f;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfffffff3;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffffcf;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffffbf;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffff7f;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffbfff;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[0x30].HDCL1 = '\x01';
    pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xfffe;
    pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xfff1;
    pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xffcf | 0x10;
    pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xffbf;
    pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xff7f;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfffffff3;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffffcf;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffffbf;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffff7f;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffbfff;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[0x31].HDCL1 = '\x01';
    pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xfffe;
    pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xfff1;
    pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xffcf | 0x10;
    pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xffbf;
    pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xff7f;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfffffff3;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffffcf;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffffbf;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffff7f;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffbfff;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[0x3c].HDCL1 = '\0';
    pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xfffe;
    pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xfff1;
    pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xffcf | 0x10;
    pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xffbf;
    pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xff7f;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfffffff3;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffffcf;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffffbf;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffff7f;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffbfff;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[0x3d].HDCL1 = '\0';
    pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xfffe;
    pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xfff1;
    pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xffcf | 0x10;
    pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xffbf;
    pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xff7f;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffffff3;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffffcf;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffffbf;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffff7f;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffbfff;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[0x3e].HDCL1 = '\0';
    pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xfffe;
    pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xfff1;
    pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xffcf | 0x10;
    pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xffbf;
    pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xff7f;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffffffc | 1;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffffff3;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffffcf;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffffbf;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffff7f;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffff8ff;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffc7ff;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffbfff;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffe7fff;
    pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfff9ffff;
    pGVar1[0x3f].HDCL1 = '\0';
    (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
    super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 8;
    (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
    super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0x31;
    (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.CurrentMaxSpecialMocsIndex = 0x3f;
  }
  else {
    pGVar2 = Context::GetPlatformInfo
                       ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                        super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                        super_GmmCachePolicyCommon.pGmmLibContext);
    if ((pGVar2->Platform).eProductFamily == IGFX_XE_HP_SDV) {
      for (index_3 = 0; index_3 < 0x40; index_3 = index_3 + 1) {
        pGVar1[index_3].L3.UshortValue = pGVar1[index_3].L3.UshortValue & 0xfffe;
        pGVar1[index_3].L3.UshortValue = pGVar1[index_3].L3.UshortValue & 0xfff1;
        pGVar1[index_3].L3.UshortValue = pGVar1[index_3].L3.UshortValue & 0xffcf | 0x30;
        pGVar1[index_3].L3.UshortValue = pGVar1[index_3].L3.UshortValue & 0xffbf;
        pGVar1[index_3].L3.UshortValue = pGVar1[index_3].L3.UshortValue & 0xff7f | 0x80;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xfffffffc | 1;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xfffffff3;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xffffffcf;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xffffffbf;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xffffff7f;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xfffff8ff;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xffffc7ff;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xffffbfff;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xfffe7fff;
        pGVar1[index_3].LeCC.DwordValue = pGVar1[index_3].LeCC.DwordValue & 0xfff9ffff;
        pGVar1[index_3].HDCL1 = '\0';
      }
      pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfffe;
      pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfff1;
      pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffbf;
      pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xff7f | 0x80;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffff3;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffcf;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffbf;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffff7f;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffbfff;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[1].HDCL1 = '\0';
      pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfffe;
      pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfff1;
      pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffbf | 0x40;
      pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xff7f | 0x80;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffff3;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffcf;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffbf;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffff7f;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffbfff;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[2].HDCL1 = '\0';
      pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfffe;
      pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfff1;
      pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffbf | 0x40;
      pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xff7f;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffff3;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffffcf;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffffbf;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffff7f;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffbfff;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[3].HDCL1 = '\0';
      pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xfffe;
      pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xfff1;
      pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xffbf;
      pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xff7f;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffffff3;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffffcf;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffffbf;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffff7f;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xffffbfff;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[4].LeCC.DwordValue = pGVar1[4].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[4].HDCL1 = '\0';
      pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xfffe;
      pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xfff1;
      pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xffcf | 0x30;
      pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xffbf;
      pGVar1[5].L3.UshortValue = pGVar1[5].L3.UshortValue & 0xff7f | 0x80;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffffff3;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffffcf;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffffbf;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffff7f;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xffffbfff;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[5].LeCC.DwordValue = pGVar1[5].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[5].HDCL1 = '\0';
      pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xfffe;
      pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xfff1;
      pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xffcf | 0x30;
      pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xffbf;
      pGVar1[0x30].L3.UshortValue = pGVar1[0x30].L3.UshortValue & 0xff7f | 0x80;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfffffff3;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffffcf;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffffbf;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffff7f;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xffffbfff;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[0x30].LeCC.DwordValue = pGVar1[0x30].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[0x30].HDCL1 = '\x01';
      pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xfffe;
      pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xfff1;
      pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xffbf;
      pGVar1[0x31].L3.UshortValue = pGVar1[0x31].L3.UshortValue & 0xff7f | 0x80;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfffffff3;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffffcf;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffffbf;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffff7f;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xffffbfff;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[0x31].LeCC.DwordValue = pGVar1[0x31].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[0x31].HDCL1 = '\x01';
      pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xfffe;
      pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xfff1;
      pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xffbf;
      pGVar1[0x3c].L3.UshortValue = pGVar1[0x3c].L3.UshortValue & 0xff7f;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfffffff3;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffffcf;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffffbf;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffff7f;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xffffbfff;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[0x3c].LeCC.DwordValue = pGVar1[0x3c].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[0x3c].HDCL1 = '\0';
      pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xfffe;
      pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xfff1;
      pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xffbf;
      pGVar1[0x3d].L3.UshortValue = pGVar1[0x3d].L3.UshortValue & 0xff7f;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfffffff3;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffffcf;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffffbf;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffff7f;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xffffbfff;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[0x3d].LeCC.DwordValue = pGVar1[0x3d].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[0x3d].HDCL1 = '\0';
      pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xfffe;
      pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xfff1;
      pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xffbf;
      pGVar1[0x3e].L3.UshortValue = pGVar1[0x3e].L3.UshortValue & 0xff7f;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffffff3;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffffcf;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffffbf;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffff7f;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xffffbfff;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[0x3e].LeCC.DwordValue = pGVar1[0x3e].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[0x3e].HDCL1 = '\0';
      pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xfffe;
      pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xfff1;
      pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xffcf | 0x10;
      pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xffbf;
      pGVar1[0x3f].L3.UshortValue = pGVar1[0x3f].L3.UshortValue & 0xff7f;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffffffc | 1;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffffff3;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffffcf;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffffbf;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffff7f;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffff8ff;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffc7ff;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xffffbfff;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfffe7fff;
      pGVar1[0x3f].LeCC.DwordValue = pGVar1[0x3f].LeCC.DwordValue & 0xfff9ffff;
      pGVar1[0x3f].HDCL1 = '\0';
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 5;
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0x31;
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.CurrentMaxSpecialMocsIndex = 0x3f;
    }
    else {
      pGVar2 = Context::GetPlatformInfo
                         ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
      if ((pGVar2->Platform).eProductFamily == IGFX_DG2) {
        for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
          pGVar1[local_24].L3.UshortValue = pGVar1[local_24].L3.UshortValue & 0xfffe;
          pGVar1[local_24].L3.UshortValue = pGVar1[local_24].L3.UshortValue & 0xfff1;
          pGVar1[local_24].L3.UshortValue = pGVar1[local_24].L3.UshortValue & 0xffcf | 0x30;
          pGVar1[local_24].L3.UshortValue = pGVar1[local_24].L3.UshortValue & 0xffbf;
          pGVar1[local_24].L3.UshortValue = pGVar1[local_24].L3.UshortValue & 0xff7f | 0x80;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xfffffffc | 1;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xfffffff3;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xffffffcf;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xffffffbf;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xffffff7f;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xfffff8ff;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xffffc7ff;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xffffbfff;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xfffe7fff;
          pGVar1[local_24].LeCC.DwordValue = pGVar1[local_24].LeCC.DwordValue & 0xfff9ffff;
          pGVar1[local_24].HDCL1 = '\0';
        }
        (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xfffe;
        (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xfff1;
        (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xffcf | 0x10;
        (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xffbf;
        (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xff7f | 0x80;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffffffc | 1;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffffff3;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffffcf;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffffbf;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffff7f;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffff8ff;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffc7ff;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xffffbfff;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfffe7fff;
        (pGVar1->LeCC).DwordValue = (pGVar1->LeCC).DwordValue & 0xfff9ffff;
        pGVar1->HDCL1 = '\0';
        pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfffe;
        pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfff1;
        pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffcf | 0x10;
        pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffbf | 0x40;
        pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xff7f | 0x80;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffffc | 1;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffff3;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffcf;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffbf;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffff7f;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffff8ff;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffc7ff;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffbfff;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffe7fff;
        pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfff9ffff;
        pGVar1[1].HDCL1 = '\0';
        pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfffe;
        pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfff1;
        pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffcf | 0x10;
        pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffbf | 0x40;
        pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xff7f;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffffc | 1;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffff3;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffcf;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffbf;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffff7f;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffff8ff;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffc7ff;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffbfff;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffe7fff;
        pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfff9ffff;
        pGVar1[2].HDCL1 = '\0';
        pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfffe;
        pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfff1;
        pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffcf | 0x30;
        pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffbf;
        pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xff7f | 0x80;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffffc | 1;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffffff3;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffffcf;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffffbf;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffff7f;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffff8ff;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffc7ff;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xffffbfff;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfffe7fff;
        pGVar1[3].LeCC.DwordValue = pGVar1[3].LeCC.DwordValue & 0xfff9ffff;
        pGVar1[3].HDCL1 = '\0';
        (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
        super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 3;
      }
      else {
        pGVar2 = Context::GetPlatformInfo
                           ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                            super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                            super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext);
        if ((pGVar2->Platform).eProductFamily == IGFX_PVC) {
          for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
            pGVar1[local_28].L3.UshortValue = pGVar1[local_28].L3.UshortValue & 0xfffe;
            pGVar1[local_28].L3.UshortValue = pGVar1[local_28].L3.UshortValue & 0xfff1;
            pGVar1[local_28].L3.UshortValue = pGVar1[local_28].L3.UshortValue & 0xffcf | 0x30;
            pGVar1[local_28].L3.UshortValue = pGVar1[local_28].L3.UshortValue & 0xffbf;
            pGVar1[local_28].L3.UshortValue = pGVar1[local_28].L3.UshortValue & 0xff7f;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xfffffffc | 1;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xfffffff3;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xffffffcf;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xffffffbf;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xffffff7f;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xfffff8ff;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xffffc7ff;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xffffbfff;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xfffe7fff;
            pGVar1[local_28].LeCC.DwordValue = pGVar1[local_28].LeCC.DwordValue & 0xfff9ffff;
            pGVar1[local_28].HDCL1 = '\0';
          }
          pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfffe;
          pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfff1;
          pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffcf | 0x10;
          pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffbf;
          pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xff7f;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffffc | 1;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffffff3;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffcf;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffffbf;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffff7f;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffff8ff;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffc7ff;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xffffbfff;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfffe7fff;
          pGVar1[1].LeCC.DwordValue = pGVar1[1].LeCC.DwordValue & 0xfff9ffff;
          pGVar1[1].HDCL1 = '\0';
          pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfffe;
          pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfff1;
          pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffcf | 0x30;
          pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffbf;
          pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xff7f;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffffc | 1;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffffff3;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffcf;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffffbf;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffff7f;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffff8ff;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffc7ff;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xffffbfff;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfffe7fff;
          pGVar1[2].LeCC.DwordValue = pGVar1[2].LeCC.DwordValue & 0xfff9ffff;
          pGVar1[2].HDCL1 = '\0';
          (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
          super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 2;
        }
      }
    }
  }
  return;
}

Assistant:

void GmmLib::GmmGen12dGPUCachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);
    CurrentMaxL1HdcMocsIndex                             = 0;
    CurrentMaxSpecialMocsIndex                           = 0;

#define GMM_DEFINE_MOCS(Index, L3_ESC, L3_SCC, L3_CC, L3_Go, L3_LookUp, _HDCL1)        \
    {                                                                                  \
        pCachePolicyTlbElement[Index].L3.ESC            = L3_ESC;                      \
        pCachePolicyTlbElement[Index].L3.SCC            = L3_SCC;                      \
        pCachePolicyTlbElement[Index].L3.Cacheability   = L3_CC;                       \
        pCachePolicyTlbElement[Index].L3.GlobalGo       = L3_Go;                       \
        pCachePolicyTlbElement[Index].L3.UCLookup       = L3_LookUp;                   \
        pCachePolicyTlbElement[Index].LeCC.Cacheability = 1;                           \
        pCachePolicyTlbElement[Index].LeCC.TargetCache  = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.LRUM         = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.AOM          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.ESC          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.SCC          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.PFM          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.SCF          = 0;                           \
        pCachePolicyTlbElement[Index].LeCC.CoS          = CLASS_SERVICE_ZERO;          \
        pCachePolicyTlbElement[Index].LeCC.SelfSnoop    = DISABLE_SELF_SNOOP_OVERRIDE; \
        pCachePolicyTlbElement[Index].HDCL1             = _HDCL1;                      \
    }

    // clang-format off

    if (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_DG1)
    {
        //Default MOCS Table
        for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
        {     //             Index     ESC    SCC    L3CC    Go      LookUp    HDCL1
             GMM_DEFINE_MOCS( index  , 0     , 0     , 3     , 0     , 0       , 0 )
        }
        // Fixed MOCS Table
        //              Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
        GMM_DEFINE_MOCS( 0      , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 1      , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 2      , 0     , 0     , 0     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 3      , 0     , 0     , 0     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 4      , 0     , 0     , 0     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 5      , 0     , 0     , 3     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 6      , 1     , 1     , 3     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 7      , 1     , 3     , 3     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 8      , 1     , 7     , 3     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 48     , 0     , 0     , 3     , 0     , 0       , 1 )
        GMM_DEFINE_MOCS( 49     , 0     , 0     , 1     , 0     , 0       , 1 )
        GMM_DEFINE_MOCS( 60     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 61     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 62     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 63     , 0     , 0     , 1     , 0     , 0       , 0 )

        CurrentMaxMocsIndex         = 8;
        CurrentMaxL1HdcMocsIndex    = 49;
        CurrentMaxSpecialMocsIndex  = 63;

    }
    else if (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_XE_HP_SDV)
     {
        //Default MOCS Table
        for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
        {     //             Index     ESC    SCC    L3CC    Go      LookUp    HDCL1
             GMM_DEFINE_MOCS( index  , 0     , 0     , 3     , 0     , 1       , 0 )
        }
        // Fixed MOCS Table
        //              Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
        GMM_DEFINE_MOCS( 1      , 0     , 0     , 1     , 0     , 1       , 0 )
        GMM_DEFINE_MOCS( 2      , 0     , 0     , 1     , 1     , 1       , 0 )
        GMM_DEFINE_MOCS( 3      , 0     , 0     , 1     , 1     , 0       , 0 )
        GMM_DEFINE_MOCS( 4      , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 5      , 0     , 0     , 3     , 0     , 1       , 0 )
        GMM_DEFINE_MOCS( 48     , 0     , 0     , 3     , 0     , 1       , 1 )
        GMM_DEFINE_MOCS( 49     , 0     , 0     , 1     , 0     , 1       , 1 )
        GMM_DEFINE_MOCS( 60     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 61     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 62     , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 63     , 0     , 0     , 1     , 0     , 0       , 0 )

        CurrentMaxMocsIndex         = 5;
        CurrentMaxL1HdcMocsIndex    = 49;
        CurrentMaxSpecialMocsIndex  = 63;

    }
    else if ((GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_DG2))
     {
        //Default MOCS Table
        for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
        {     //             Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
             GMM_DEFINE_MOCS( index  , 0     , 0     , 3     , 0     , 1       , 0 )
        }
         // Fixed MOCS Table
        //              Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
        GMM_DEFINE_MOCS( 0      , 0     , 0     , 1     , 0     , 1       , 0 )
        GMM_DEFINE_MOCS( 1      , 0     , 0     , 1     , 1     , 1       , 0 )
        GMM_DEFINE_MOCS( 2      , 0     , 0     , 1     , 1     , 0       , 0 )
        GMM_DEFINE_MOCS( 3      , 0     , 0     , 3     , 0     , 1       , 0 )

        CurrentMaxMocsIndex         = 3;
    }
    else if (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_PVC) 
     {
         //Default MOCS Table
        for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
        {     //             Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
             GMM_DEFINE_MOCS( index  , 0     , 0     , 3     , 0     , 0       , 0 )
        }
         // Fixed MOCS Table
        //              Index     ESC	  SCC	  L3CC    Go      LookUp    HDCL1
        GMM_DEFINE_MOCS( 1      , 0     , 0     , 1     , 0     , 0       , 0 )
        GMM_DEFINE_MOCS( 2      , 0     , 0     , 3     , 0     , 0       , 0 )

        CurrentMaxMocsIndex         = 2;
     }
// clang-format on


#undef GMM_DEFINE_MOCS
}